

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

linkedMoveList parseMoveString(string *movesList)

{
  linkedMoveList lVar1;
  bool bVar2;
  move value;
  linkedMoveList returnList;
  string editList;
  linkedMoveList local_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_c8.head = (moveNode *)0x0;
  local_c8.tail = (moveNode *)0x0;
  std::__cxx11::string::string((string *)&local_90,(string *)movesList);
  while( true ) {
    bVar2 = std::operator!=(&local_90,"");
    if (!bVar2) break;
    std::__cxx11::string::string((string *)&local_50,(string *)&local_90);
    getFirstToken(&local_b0,&local_50);
    value = algebraicToMove(local_b0._M_dataplus._M_p);
    linkedMoveList::add(&local_c8,value);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&local_90);
    removeFirstToken(&local_b0,&local_70);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_90);
  lVar1.tail = local_c8.tail;
  lVar1.head = local_c8.head;
  return lVar1;
}

Assistant:

linkedMoveList parseMoveString(std::string movesList) {
  linkedMoveList returnList;
  std::string editList = movesList;
  while(editList != "") {
    returnList.add(algebraicToMove(getFirstToken(editList).c_str()));
    editList = removeFirstToken(editList);
  }
  return returnList;
}